

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

void __thiscall
pbrt::SurfaceInteraction::SurfaceInteraction
          (SurfaceInteraction *this,Point3fi pi,Point2f uv,Vector3f wo,Vector3f dpdu,Vector3f dpdv,
          Normal3f dndu,Normal3f dndv,Float time,bool flipNormal)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  ulong uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined3 in_register_00000031;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar25;
  undefined8 uVar26;
  undefined8 in_XMM3_Qb;
  float fVar27;
  undefined1 in_register_00001304 [12];
  undefined8 in_XMM5_Qb;
  float fVar28;
  undefined1 in_register_00001384 [12];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  auVar21._8_56_ = in_register_00001208;
  auVar21._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  fVar28 = dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar27 = dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar26 = dpdu.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  fVar25 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._8_56_ = wo._8_56_;
  auVar24._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar37._8_8_ = in_XMM3_Qb;
  auVar37._0_8_ = uVar26;
  auVar19 = vmovshdup_avx(auVar37);
  uVar10 = dpdv.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_8_ = in_XMM5_Qb;
  auVar9._0_8_ = uVar10;
  auVar18 = vmovshdup_avx(auVar9);
  auVar7._4_12_ = in_register_00001304;
  auVar7._0_4_ = fVar27;
  auVar16._4_12_ = in_register_00001384;
  auVar16._0_4_ = fVar28;
  auVar37 = vinsertps_avx(auVar7,auVar16,0x10);
  auVar17._4_12_ = in_register_00001384;
  auVar17._0_4_ = fVar28;
  auVar31 = vinsertps_avx(auVar18,auVar17,0x10);
  auVar5._8_8_ = in_XMM3_Qb;
  auVar5._0_8_ = uVar26;
  auVar34 = ZEXT416((uint)(auVar19._0_4_ * dpdv.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar18 = vfmsub213ss_fma(auVar18,auVar5,auVar34);
  auVar11._8_8_ = in_XMM5_Qb;
  auVar11._0_8_ = uVar10;
  auVar19 = vfnmadd213ss_fma(auVar19,auVar11,auVar34);
  auVar34._8_8_ = in_XMM3_Qb;
  auVar34._0_8_ = uVar26;
  (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  fVar4 = auVar18._0_4_ + auVar19._0_4_;
  auVar12._8_8_ = in_XMM5_Qb;
  auVar12._0_8_ = uVar10;
  auVar18 = vpermt2ps_avx512vl(auVar34,_DAT_003c76d0,auVar12);
  auVar19._8_8_ = in_XMM3_Qb;
  auVar19._0_8_ = uVar26;
  auVar13._8_8_ = in_XMM5_Qb;
  auVar13._0_8_ = uVar10;
  auVar19 = vpermi2ps_avx512vl(_DAT_003c76d0,auVar13,auVar19);
  auVar35._0_4_ = auVar18._0_4_ * auVar37._0_4_;
  auVar35._4_4_ = auVar18._4_4_ * auVar37._4_4_;
  auVar35._8_4_ = auVar18._8_4_ * auVar37._8_4_;
  auVar35._12_4_ = auVar18._12_4_ * auVar37._12_4_;
  auVar37 = vshufps_avx(auVar37,auVar37,0xe1);
  auVar37 = vfmsub213ps_fma(auVar37,auVar19,auVar35);
  auVar18._8_8_ = in_XMM3_Qb;
  auVar18._0_8_ = uVar26;
  auVar8._4_12_ = in_register_00001304;
  auVar8._0_4_ = fVar27;
  auVar19 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar18,auVar8);
  auVar31 = vfnmadd213ps_fma(auVar31,auVar19,auVar35);
  auVar32._0_4_ = auVar37._0_4_ + auVar31._0_4_;
  auVar32._4_4_ = auVar37._4_4_ + auVar31._4_4_;
  auVar32._8_4_ = auVar37._8_4_ + auVar31._8_4_;
  auVar32._12_4_ = auVar37._12_4_ + auVar31._12_4_;
  auVar36._0_4_ = auVar32._0_4_ * auVar32._0_4_;
  auVar36._4_4_ = auVar32._4_4_ * auVar32._4_4_;
  auVar36._8_4_ = auVar32._8_4_ * auVar32._8_4_;
  auVar36._12_4_ = auVar32._12_4_ * auVar32._12_4_;
  auVar37 = vhaddps_avx(auVar36,auVar36);
  auVar37 = ZEXT416((uint)(fVar4 * fVar4 + auVar37._0_4_));
  auVar37 = vsqrtss_avx(auVar37,auVar37);
  fVar33 = auVar37._0_4_;
  auVar39._4_4_ = fVar33;
  auVar39._0_4_ = fVar33;
  auVar39._8_4_ = fVar33;
  auVar39._12_4_ = fVar33;
  auVar37 = vdivps_avx(auVar32,auVar39);
  (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  (this->super_Interaction).time = time;
  auVar30._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.x * wo.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar30._4_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.y * wo.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar30._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z * wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar30._12_4_ = wo._12_4_ * wo._12_4_;
  auVar31 = vhaddps_avx(auVar30,auVar30);
  auVar31 = ZEXT416((uint)(fVar25 * fVar25 + auVar31._0_4_));
  auVar31 = vsqrtss_avx(auVar31,auVar31);
  fVar29 = auVar31._0_4_;
  auVar38._4_4_ = fVar29;
  auVar38._0_4_ = fVar29;
  auVar38._8_4_ = fVar29;
  auVar38._12_4_ = fVar29;
  auVar31 = vdivps_avx(auVar24._0_16_,auVar38);
  uVar1 = vmovlps_avx(auVar31);
  (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z = fVar25 / fVar29;
  uVar1 = vmovlps_avx(auVar37);
  (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z = fVar4 / fVar33;
  TVar2 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar21._0_16_);
  (this->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float> = TVar2;
  (this->super_Interaction).mediumInterface = (MediumInterface *)0x0;
  (this->super_Interaction).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  auVar31._8_8_ = in_XMM3_Qb;
  auVar31._0_8_ = uVar26;
  uVar1 = vmovlps_avx(auVar31);
  (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.z = fVar27;
  auVar14._8_8_ = in_XMM5_Qb;
  auVar14._0_8_ = uVar10;
  uVar1 = vmovlps_avx(auVar14);
  (this->dpdv).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->dpdv).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->dpdv).super_Tuple3<pbrt::Vector3,_float>.z = fVar28;
  (this->dndu).super_Tuple3<pbrt::Normal3,_float>.x = dndu.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->dndu).super_Tuple3<pbrt::Normal3,_float>.y = dndu.super_Tuple3<pbrt::Normal3,_float>.y;
  (this->dndu).super_Tuple3<pbrt::Normal3,_float>.z = dndu.super_Tuple3<pbrt::Normal3,_float>.z;
  (this->dndv).super_Tuple3<pbrt::Normal3,_float>.x = dndv.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->dndv).super_Tuple3<pbrt::Normal3,_float>.y = dndv.super_Tuple3<pbrt::Normal3,_float>.y;
  (this->dndv).super_Tuple3<pbrt::Normal3,_float>.z = dndv.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar20 = ZEXT432(0) << 0x40;
  this->faceIndex = auVar20._0_4_;
  this->material = (MaterialHandle)auVar20._4_8_;
  this->areaLight = (LightHandle)auVar20._12_8_;
  this->dpdx = (Vector3f)auVar20._20_12_;
  *(undefined1 (*) [32])&(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = auVar20;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar25 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar25;
  auVar6._8_8_ = in_XMM3_Qb;
  auVar6._0_8_ = uVar26;
  uVar1 = vmovlps_avx(auVar6);
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = fVar27;
  auVar15._8_8_ = in_XMM5_Qb;
  auVar15._0_8_ = uVar10;
  uVar1 = vmovlps_avx(auVar15);
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = fVar28;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       dndu.super_Tuple3<pbrt::Normal3,_float>.z;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x =
       dndu.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y =
       dndu.super_Tuple3<pbrt::Normal3,_float>.y;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x =
       dndv.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       dndv.super_Tuple3<pbrt::Normal3,_float>.y;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       dndv.super_Tuple3<pbrt::Normal3,_float>.z;
  if (CONCAT31(in_register_00000031,flipNormal) != 0) {
    auVar22._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
    auVar22._8_4_ = auVar37._8_4_ ^ 0x80000000;
    auVar22._12_4_ = auVar37._12_4_ ^ 0x80000000;
    uVar1 = vmovlps_avx(auVar22);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z = -(fVar4 / fVar33);
    uVar3._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar3._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar23._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar23._8_4_ = 0x80000000;
    auVar23._12_4_ = 0x80000000;
    uVar1 = vmovlps_avx(auVar23);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
         -(this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  return;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v, const Vector3<T> &w) {
    DCHECK(!v.HasNaN() && !w.HasNaN());
    return {DifferenceOfProducts(v.y, w.z, v.z, w.y),
            DifferenceOfProducts(v.z, w.x, v.x, w.z),
            DifferenceOfProducts(v.x, w.y, v.y, w.x)};
}